

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

aspa_status aspa_array_create(aspa_array **array_ptr)

{
  long lVar1;
  aspa_record *ptr;
  aspa_array *paVar2;
  long in_FS_OFFSET;
  aspa_array *array;
  aspa_record *data_field;
  size_t default_initial_size;
  aspa_array **array_ptr_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = (aspa_record *)lrtr_malloc(0xc00);
  if (ptr == (aspa_record *)0x0) {
    array_ptr_local._4_4_ = ASPA_ERROR;
  }
  else {
    paVar2 = (aspa_array *)lrtr_malloc(0x18);
    if (paVar2 == (aspa_array *)0x0) {
      lrtr_free(ptr);
      array_ptr_local._4_4_ = ASPA_ERROR;
    }
    else {
      paVar2->capacity = 0x80;
      paVar2->size = 0;
      paVar2->data = ptr;
      *array_ptr = paVar2;
      array_ptr_local._4_4_ = ASPA_SUCCESS;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return array_ptr_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_array_create(struct aspa_array **array_ptr)
{
	const size_t default_initial_size = 128;

	// allocation the chunk of memory of the provider as numbers
	struct aspa_record *data_field = lrtr_malloc(sizeof(struct aspa_record) * default_initial_size);

	if (!data_field)
		return ASPA_ERROR;

	struct aspa_array *array = lrtr_malloc(sizeof(struct aspa_array));

	if (!array) {
		lrtr_free(data_field);
		return ASPA_ERROR;
	}

	// initializing member variables of the aspa record
	array->capacity = default_initial_size;
	array->size = 0;
	array->data = data_field;

	// returning the array
	*array_ptr = array;

	return ASPA_SUCCESS;
}